

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTLogicExpression.cpp
# Opt level: O1

void __thiscall MathML::AST::LogicExpression::~LogicExpression(LogicExpression *this)

{
  pointer ppIVar1;
  ulong uVar2;
  
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__LogicExpression_009e2968;
  ppIVar1 = (this->mOperands).
            super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->mOperands).
      super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppIVar1) {
    uVar2 = 0;
    do {
      if (ppIVar1[uVar2] != (INode *)0x0) {
        (*ppIVar1[uVar2]->_vptr_INode[1])();
      }
      uVar2 = uVar2 + 1;
      ppIVar1 = (this->mOperands).
                super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->mOperands).
                                   super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1 >> 3))
    ;
  }
  if (ppIVar1 != (pointer)0x0) {
    operator_delete(ppIVar1,(long)(this->mOperands).
                                  super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar1
                   );
    return;
  }
  return;
}

Assistant:

LogicExpression::~LogicExpression()
        {
            for (size_t i=0; i<mOperands.size(); ++i)
            {
                delete mOperands.at( i );
            }
        }